

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O3

void __thiscall cmGeneratedFileStreamBase::Open(cmGeneratedFileStreamBase *this,string *name)

{
  string *source;
  string dir;
  string local_30;
  
  std::__cxx11::string::_M_assign((string *)this);
  source = &this->TempName;
  std::__cxx11::string::_M_assign((string *)source);
  std::__cxx11::string::append((char *)source);
  cmsys::SystemTools::RemoveFile(source);
  cmsys::SystemTools::GetFilenamePath(&local_30,source);
  cmsys::SystemTools::MakeDirectory(&local_30,(mode_t *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratedFileStreamBase::Open(std::string const& name)
{
  // Save the original name of the file.
  this->Name = name;

  // Create the name of the temporary file.
  this->TempName = name;
#if defined(__VMS)
  this->TempName += "_tmp";
#else
  this->TempName += ".tmp";
#endif

  // Make sure the temporary file that will be used is not present.
  cmSystemTools::RemoveFile(this->TempName);

  std::string dir = cmSystemTools::GetFilenamePath(this->TempName);
  cmSystemTools::MakeDirectory(dir);
}